

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

void Ivy_TruthDsdPrint_rec(FILE *pFile,int iNode,Vec_Int_t *vTree)

{
  Ivy_Dec_t IVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  Ivy_Dec_t Node;
  
  IVar1 = (Ivy_Dec_t)Vec_IntEntry(vTree,iNode);
  Node = IVar1;
  switch((uint)IVar1 & 0xf) {
  case 0:
    pcVar4 = "\'";
    if (((uint)IVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    fprintf((FILE *)pFile,"%c%s",(ulong)(iNode + 0x61),pcVar4);
    return;
  case 1:
    pcVar4 = "\'";
    if (((uint)IVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    pcVar6 = "Const1%s";
    break;
  case 2:
    Ivy_TruthDsdPrint_rec(pFile,(uint)IVar1 >> 9 & 7,vTree);
    pcVar4 = "\'";
    if (((uint)IVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    fputs(pcVar4,(FILE *)pFile);
    return;
  case 3:
    fwrite("AND(",4,1,(FILE *)pFile);
    uVar5 = (uint)IVar1 >> 5 & 7;
    pcVar4 = "\'";
    for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
      uVar2 = Ivy_DecGetVar(&Node,uVar3);
      Ivy_TruthDsdPrint_rec(pFile,uVar2 >> 1,vTree);
      pcVar6 = "\'";
      if ((uVar2 & 1) == 0) {
        pcVar6 = "";
      }
      fputs(pcVar6,(FILE *)pFile);
      if (uVar3 - uVar5 != -1) {
        fputc(0x2c,(FILE *)pFile);
      }
    }
    if (((uint)IVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    pcVar6 = ")%s";
    break;
  case 4:
    fwrite("EXOR(",5,1,(FILE *)pFile);
    uVar3 = (uint)IVar1 >> 5 & 7;
    uVar5 = 0;
    while (uVar5 != uVar3) {
      uVar2 = Ivy_DecGetVar(&Node,uVar5);
      Ivy_TruthDsdPrint_rec(pFile,uVar2 >> 1,vTree);
      if (uVar5 - uVar3 != -1) {
        fputc(0x2c,(FILE *)pFile);
      }
      uVar5 = uVar5 + 1;
      if ((uVar2 & 1) != 0) {
        __assert_fail("(Var & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                      ,0x213,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
      }
    }
    pcVar4 = "\'";
    if (((uint)IVar1 & 0x10) == 0) {
      pcVar4 = "";
    }
    pcVar6 = ")%s";
    break;
  case 5:
  case 6:
    if (((uint)IVar1 & 0x10) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                    ,0x21a,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
    }
    pcVar4 = "MAJ(";
    if (((uint)IVar1 & 0xf) == 5) {
      pcVar4 = "MUX(";
    }
    fputs(pcVar4,(FILE *)pFile);
    Ivy_TruthDsdPrint_rec(pFile,(uint)IVar1 >> 9 & 7,vTree);
    pcVar6 = "\'";
    pcVar4 = "\'";
    if (((uint)IVar1 >> 8 & 1) == 0) {
      pcVar4 = "";
    }
    fputs(pcVar4,(FILE *)pFile);
    fputc(0x2c,(FILE *)pFile);
    Ivy_TruthDsdPrint_rec(pFile,(uint)IVar1 >> 0xd & 7,vTree);
    pcVar4 = "\'";
    if (((uint)IVar1 >> 0xc & 1) == 0) {
      pcVar4 = "";
    }
    fputs(pcVar4,(FILE *)pFile);
    fputc(0x2c,(FILE *)pFile);
    Ivy_TruthDsdPrint_rec(pFile,(uint)IVar1 >> 0x11 & 7,vTree);
    if (((uint)IVar1 >> 0x10 & 1) == 0) {
      pcVar6 = "";
    }
    fputs(pcVar6,(FILE *)pFile);
    fputc(0x29,(FILE *)pFile);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                  ,0x229,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
  }
  fprintf((FILE *)pFile,pcVar6,pcVar4);
  return;
}

Assistant:

void Ivy_TruthDsdPrint_rec( FILE * pFile, int iNode, Vec_Int_t * vTree )
{
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        fprintf( pFile, "Const1%s", (Node.fCompl? "\'" : "") );
    else if ( Node.Type == IVY_DEC_PI )
        fprintf( pFile, "%c%s", 'a' + iNode, (Node.fCompl? "\'" : "") );
    else if ( Node.Type == IVY_DEC_BUF )
    {
        Ivy_TruthDsdPrint_rec( pFile, Node.Fan0 >> 1, vTree );
        fprintf( pFile, "%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_AND )
    {
        fprintf( pFile, "AND(" );
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            Ivy_TruthDsdPrint_rec( pFile, Var >> 1, vTree );
            fprintf( pFile, "%s", (Var & 1)? "\'" : "" );
            if ( i != (int)Node.nFans-1 )
                fprintf( pFile, "," );
        }
        fprintf( pFile, ")%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
    {
        fprintf( pFile, "EXOR(" );
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            Ivy_TruthDsdPrint_rec( pFile, Var >> 1, vTree );
            if ( i != (int)Node.nFans-1 )
                fprintf( pFile, "," );
            assert( (Var & 1) == 0 );
        }
        fprintf( pFile, ")%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        int VarC, Var1, Var0;
        assert( Node.fCompl == 0 );
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        fprintf( pFile, "%s", (Node.Type == IVY_DEC_MUX)? "MUX(" : "MAJ(" );
        Ivy_TruthDsdPrint_rec( pFile, VarC >> 1, vTree );
        fprintf( pFile, "%s", (VarC & 1)? "\'" : "" );
        fprintf( pFile, "," );
        Ivy_TruthDsdPrint_rec( pFile, Var1 >> 1, vTree );
        fprintf( pFile, "%s", (Var1 & 1)? "\'" : "" );
        fprintf( pFile, "," );
        Ivy_TruthDsdPrint_rec( pFile, Var0 >> 1, vTree );
        fprintf( pFile, "%s", (Var0 & 1)? "\'" : "" );
        fprintf( pFile, ")" );
    }
    else assert( 0 );
}